

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O3

void grabForPopup(QWidget *popup)

{
  QDebug QVar1;
  QWidgetPrivate *pQVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QDebug local_50;
  undefined1 local_48 [40];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = qt_widget_private(popup);
  popupGrabOk = QWidgetPrivate::stealKeyboardGrab(pQVar2,true);
  if (popupGrabOk) {
    pQVar2 = qt_widget_private(popup);
    popupGrabOk = QWidgetPrivate::stealMouseGrab(pQVar2,true);
    if (!popupGrabOk) {
      ungrabKeyboardForPopup(popup);
    }
  }
  lcWidgetPopup();
  if (((byte)lcWidgetPopup::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    QMessageLogger::debug();
    QVar1.stream = local_50.stream;
    QVar4.m_data = (storage_type *)0x1b;
    QVar4.m_size = (qsizetype)(local_48 + 0x10);
    QString::fromUtf8(QVar4);
    QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)(local_48 + 0x10));
    if ((QArrayData *)local_48._16_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_48._16_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_48._16_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_48._16_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_48._16_8_,2,0x10);
      }
    }
    if (*(QTextStream *)(local_50.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_50.stream,' ');
    }
    pcVar3 = "false";
    if (popupGrabOk != false) {
      pcVar3 = "true";
    }
    QTextStream::operator<<((QTextStream *)local_50.stream,pcVar3);
    if (*(QTextStream *)(local_50.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_50.stream,' ');
    }
    QVar1.stream = local_50.stream;
    QVar5.m_data = (storage_type *)0x9;
    QVar5.m_size = (qsizetype)(local_48 + 0x10);
    QString::fromUtf8(QVar5);
    QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)(local_48 + 0x10));
    if ((QArrayData *)local_48._16_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_48._16_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_48._16_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_48._16_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_48._16_8_,2,0x10);
      }
    }
    if (*(QTextStream *)(local_50.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_50.stream,' ');
    }
    *(int *)((QTextStream *)local_50.stream + 0x28) =
         *(int *)((QTextStream *)local_50.stream + 0x28) + 1;
    operator<<((Stream *)(local_48 + 8),(QWidget *)local_48);
    QDebug::~QDebug((QDebug *)(local_48 + 8));
    QDebug::~QDebug((QDebug *)local_48);
    QDebug::~QDebug(&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void grabForPopup(QWidget *popup)
{
    Q_ASSERT(popup->testAttribute(Qt::WA_WState_Created));
    popupGrabOk = qt_widget_private(popup)->stealKeyboardGrab(true);
    if (popupGrabOk) {
        popupGrabOk = qt_widget_private(popup)->stealMouseGrab(true);
        if (!popupGrabOk) {
            // transfer grab back to the keyboard grabber if any
            ungrabKeyboardForPopup(popup);
        }
    }
    qCDebug(lcWidgetPopup) << "grabbed mouse and keyboard?" << popupGrabOk << "for popup" << popup;
}